

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tostring.hpp
# Opt level: O0

string * Catch::Detail::stringify<(anonymous_namespace)::Constructable_const*>(Constructable **e)

{
  string *in_RDI;
  Constructable *in_stack_00000018;
  
  StringMaker<(anonymous_namespace)::Constructable_const*,void>::
  convert<(anonymous_namespace)::Constructable_const>(in_stack_00000018);
  return in_RDI;
}

Assistant:

std::string stringify(const T& e) {
            return ::Catch::StringMaker<std::remove_cv_t<std::remove_reference_t<T>>>::convert(e);
        }